

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

GMTOffsetField *
icu_63::GMTOffsetField::createTimeField(FieldType type,uint8_t width,UErrorCode *status)

{
  UBool UVar1;
  GMTOffsetField *this;
  uint8_t uVar2;
  undefined7 in_register_00000031;
  GMTOffsetField *local_50;
  GMTOffsetField *result;
  UErrorCode *status_local;
  uint8_t width_local;
  GMTOffsetField *pGStack_10;
  FieldType type_local;
  
  uVar2 = width;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this = (GMTOffsetField *)
           UMemory::operator_new((UMemory *)0x18,CONCAT71(in_register_00000031,uVar2));
    local_50 = (GMTOffsetField *)0x0;
    if (this != (GMTOffsetField *)0x0) {
      GMTOffsetField(this);
      local_50 = this;
    }
    if (local_50 == (GMTOffsetField *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      pGStack_10 = (GMTOffsetField *)0x0;
    }
    else {
      local_50->fType = type;
      local_50->fWidth = width;
      pGStack_10 = local_50;
    }
  }
  else {
    pGStack_10 = (GMTOffsetField *)0x0;
  }
  return pGStack_10;
}

Assistant:

GMTOffsetField*
GMTOffsetField::createTimeField(FieldType type, uint8_t width, UErrorCode& status) {
    U_ASSERT(type != TEXT);
    if (U_FAILURE(status)) {
        return NULL;
    }
    GMTOffsetField* result = new GMTOffsetField();
    if (result == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }

    result->fType = type;
    result->fWidth = width;

    return result;
}